

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerTest::iterate(SamplerTest *this)

{
  TestLog *log;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  Sampler sampler;
  CallLogWrapper gl;
  ResultCollector result;
  string local_a0;
  CallLogWrapper local_80;
  ResultCollector local_68;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_80,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_68,log,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                             local_a0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_SAMPLER);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)&local_a0,(Functions *)CONCAT44(extraout_var_00,iVar1),traits);
  local_80.m_enableLog = true;
  this->m_target = local_a0.field_2._M_allocated_capacity._0_4_;
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,&local_80,&local_68);
  this->m_target = 0;
  tcu::ResultCollector::setTestContextResult
            (&local_68,(this->super_TestCase).super_TestNode.m_testCtx);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_message._M_dataplus._M_p != &local_68.m_message.field_2) {
    operator_delete(local_68.m_message._M_dataplus._M_p,
                    local_68.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_prefix._M_dataplus._M_p != &local_68.m_prefix.field_2) {
    operator_delete(local_68.m_prefix._M_dataplus._M_p,
                    local_68.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_80);
  return STOP;
}

Assistant:

SamplerTest::IterateResult SamplerTest::iterate (void)
{
	glu::CallLogWrapper		gl		(m_renderCtx.getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	glu::Sampler			sampler	(m_renderCtx);

	gl.enableLogging(true);

	m_target = *sampler;
	test(gl, result);
	m_target = 0;

	result.setTestContextResult(m_testCtx);
	return STOP;
}